

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileDescriptor.cxx
# Opt level: O0

void __thiscall SSD1306::FileDescriptor::FileDescriptor(FileDescriptor *this,FileDescriptor *rhs)

{
  function<bool_(int)> *in_RSI;
  undefined4 *in_RDI;
  function<bool_(int)> *in_stack_ffffffffffffffe8;
  
  *in_RDI = *(undefined4 *)&(in_RSI->super__Function_base)._M_functor;
  std::function<bool_(int)>::function(in_RSI,in_stack_ffffffffffffffe8);
  *(undefined4 *)&(in_RSI->super__Function_base)._M_functor = 0xffffffff;
  std::function<bool(int)>::operator=((function<bool_(int)> *)this,(anon_class_1_0_00000001 *)rhs);
  return;
}

Assistant:

SSD1306::FileDescriptor::FileDescriptor(
    SSD1306::FileDescriptor&& rhs)
:
    fd_{rhs.fd_},
    close_if_{std::move(rhs.close_if_)}
{
    rhs.fd_ = -1;
    rhs.close_if_ = [](int) { return false; };
}